

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_get_seg(uint16 **seg,int32 *n_seg)

{
  int iVar1;
  char *file;
  undefined8 local_28;
  char *rel_path;
  int32 *n_seg_local;
  uint16 **seg_local;
  
  if (requires_seg == 0) {
    seg_local._4_4_ = -1;
  }
  else {
    if (cur_ctl_utt_id == (char *)0x0) {
      local_28 = cur_ctl_path;
    }
    else {
      local_28 = cur_ctl_utt_id;
    }
    file = mk_filename(2,local_28);
    iVar1 = areadshort(file,(short **)seg,n_seg);
    if (iVar1 < 0) {
      seg_local._4_4_ = -1;
    }
    else {
      seg_local._4_4_ = 0;
    }
  }
  return seg_local._4_4_;
}

Assistant:

int
corpus_get_seg(uint16 **seg,
	       int32 *n_seg)
{
    char *rel_path;

    if (!requires_seg) {
	/* asked for seg data, but not set up to send it */
	return S3_ERROR;
    }

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else
	rel_path = cur_ctl_path;

    if (areadshort(mk_filename(DATA_TYPE_SEG, rel_path), (int16**)seg, n_seg) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}